

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_job_help.hh
# Opt level: O0

void add_help_5(QPDFArgParser *ap)

{
  QPDFArgParser *pQVar1;
  allocator<char> local_bd1;
  string local_bd0;
  allocator<char> local_ba9;
  string local_ba8;
  allocator<char> local_b81;
  string local_b80;
  allocator<char> local_b59;
  string local_b58;
  allocator<char> local_b31;
  string local_b30;
  allocator<char> local_b09;
  string local_b08;
  allocator<char> local_ae1;
  string local_ae0;
  allocator<char> local_ab9;
  string local_ab8;
  allocator<char> local_a91;
  string local_a90;
  allocator<char> local_a69;
  string local_a68;
  allocator<char> local_a41;
  string local_a40;
  allocator<char> local_a19;
  string local_a18;
  allocator<char> local_9f1;
  string local_9f0;
  allocator<char> local_9c9;
  string local_9c8;
  allocator<char> local_9a1;
  string local_9a0;
  allocator<char> local_979;
  string local_978;
  allocator<char> local_951;
  string local_950;
  allocator<char> local_929;
  string local_928;
  allocator<char> local_901;
  string local_900;
  allocator<char> local_8d9;
  string local_8d8;
  allocator<char> local_8b1;
  string local_8b0;
  allocator<char> local_889;
  string local_888;
  allocator<char> local_861;
  string local_860;
  allocator<char> local_839;
  string local_838;
  allocator<char> local_811;
  string local_810;
  allocator<char> local_7e9;
  string local_7e8;
  allocator<char> local_7c1;
  string local_7c0;
  allocator<char> local_799;
  string local_798;
  allocator<char> local_771;
  string local_770;
  allocator<char> local_749;
  string local_748;
  allocator<char> local_721;
  string local_720;
  allocator<char> local_6f9;
  string local_6f8;
  allocator<char> local_6d1;
  string local_6d0;
  allocator<char> local_6a9;
  string local_6a8;
  allocator<char> local_681;
  string local_680;
  allocator<char> local_659;
  string local_658;
  allocator<char> local_631;
  string local_630;
  allocator<char> local_609;
  string local_608;
  allocator<char> local_5e1;
  string local_5e0;
  allocator<char> local_5b9;
  string local_5b8;
  allocator<char> local_591;
  string local_590;
  allocator<char> local_569;
  string local_568;
  allocator<char> local_541;
  string local_540;
  allocator<char> local_519;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  QPDFArgParser *local_10;
  QPDFArgParser *ap_local;
  
  local_10 = ap;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"--remove-info",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"modification",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"remove file information",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "Exclude file information (except modification date) from the output file.\n",&local_b9
            );
  QPDFArgParser::addOptionHelp(ap,&local_30,&local_68,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"--remove-metadata",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"modification",&local_109)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"remove metadata",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"Exclude metadata from the output file.\n",&local_159);
  QPDFArgParser::addOptionHelp(pQVar1,&local_e0,&local_108,&local_130,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"--remove-page-labels",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"modification",&local_1a9)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"remove explicit page numbers",&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,
             "Exclude page labels (explicit page numbers) from the output file.\n",&local_1f9);
  QPDFArgParser::addOptionHelp(pQVar1,&local_180,&local_1a8,&local_1d0,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"--remove-structure",&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"modification",&local_249)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"remove metadata",&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"Exclude the structure tree from the output file.\n",&local_299);
  QPDFArgParser::addOptionHelp(pQVar1,&local_220,&local_248,&local_270,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"--set-page-labels",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"modification",&local_2e9)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"number pages for the entire document",&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,
             "--set-page-labels label-spec ... --\n\nSet page labels (explicit page numbers) for the entire file.\nEach label-spec has the form\n\nfirst-page:[type][/start[/prefix]]\n\nwhere\n\n- \"first-page\" represents a sequential page number using the\n  same format as page ranges: a number, a number preceded by \"r\"\n  to indicate counting from the end, or \"z\" indicating the last\n  page\n- \"type\" is one of\n  - D: Arabic numerals (digits)\n  - A: Upper-case alphabetic characters\n  - a: Lower-case alphabetic characters\n  - R: Upper-case Roman numerals\n  - r: Lower-case Roman numerals\n  - omitted: the page number does not appear, though the prefix,\n    if specified will still appear\n- \"start\" must be a number >= 1\n- \"prefix\"` may be any string and is prepended to each page\n  label\n\nThe first label spec must have a first-page value of 1,\nindicating the first page of the document. If multiple page\nlabel specs are specified, they must be given in increasing\norder.\n\nIf multiple page label specs are specified, they must be given\nin increasing order.\n\nA given page label spec causes pages to be numbered according to\nthat scheme starting with first-page and continuing until the\nnext label spec or the end of the document. If you want to omit\nnumbering starting at a certain page, you can use first-page: as\nthe spec.\n\nExample: \"1:r 5:D\" would number the first four pages i through\niv, then the remaining pages with Arabic numerals starting with\n1 and continuing sequentially until the end of the document. For\nadditional examples, please consult the manual.\n"
             ,&local_339);
  QPDFArgParser::addOptionHelp(pQVar1,&local_2c0,&local_2e8,&local_310,&local_338);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"encryption",&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,"create encrypted files",&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b0,
             "Create encrypted files. Usage:\n\n--encrypt \\\n  [--user-password=user-password] \\\n  [--owner-password=owner-password] \\\n  --bits=key-length [options] --\n\nOR\n\n--encrypt user-password owner-password key-length [options] --\n\nThe first form, with flags for the passwords and bit length, was\nintroduced in qpdf 11.7.0. Only the --bits option is mandatory.\nThis form allows you to use any text as the password. If passwords\nare specified, they must be given before the --bits option.\n\nThe second form has been in qpdf since the beginning and will\ncontinue to be supported. Either or both of user-password and\nowner-password may be empty strings.\n\nThe key-length parameter must be either 40, 128, or 256. The user\nand/or owner password may be omitted. Omitting either password\nenables the PDF file to be opened without a password. Specifying\nthe same value for the user and owner password and specifying an\nempty owner password are both considered insecure.\n\nEncryption options are terminated by \"--\" by itself.\n\n40-bit encryption is insecure, as is 128-bit encryption without\nAES. Use 256-bit encryption unless you have a specific reason to\nuse an insecure format, such as testing or compatibility with very\nold viewers. You must use the --allow-weak-crypto flag to create\nencrypted files that use insecure cryptographic algorithms. The\n--allow-weak-crypto flag appears outside of --encrypt ... --\n(before --encrypt or after --).\n\nAvailable options vary by key length. Not all readers respect all\nrestrictions. Different PDF readers respond differently to various\ncombinations of options. Sometimes a PDF viewer may show you\nrestrictions that differ from what you selected. This is probably\nnot a bug in qpdf.\n\nOptions for 40-bit only:\n  --annotate=[y|n]         restrict comments, filling forms, and signing\n  --extract=[y|n]          restrict text/graphic extraction\n  --modify=[y|n]           restrict document modification\n  --print=[y|n]            restrict printing\n\nOptions for 128-bit or 256-bit:\n  --accessibility=[y|n]    restrict accessibility (..." /* TRUNCATED STRING LITERAL */
             ,&local_3b1);
  QPDFArgParser::addHelpTopic(pQVar1,&local_360,&local_388,&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d8,"--user-password",&local_3d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"encryption",&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,"specify user password",&local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,
             "--user-password=user-password\n\nSet the user password of the encrypted file.\n",
             &local_451);
  QPDFArgParser::addOptionHelp(pQVar1,&local_3d8,&local_400,&local_428,&local_450);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,"--owner-password",&local_479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,"encryption",&local_4a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"specify owner password",&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,
             "--owner-password=owner-password\n\nSet the owner password of the encrypted file.\n",
             &local_4f1);
  QPDFArgParser::addOptionHelp(pQVar1,&local_478,&local_4a0,&local_4c8,&local_4f0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator(&local_479);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,"--bits",&local_519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_540,"encryption",&local_541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,"specify encryption key length",&local_569);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_590,
             "--bits={48|128|256}\n\nSpecify the encryption key length. For best security, always use\na key length of 256.\n"
             ,&local_591);
  QPDFArgParser::addOptionHelp(pQVar1,&local_518,&local_540,&local_568,&local_590);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator(&local_591);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator(&local_569);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator(&local_541);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator(&local_519);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,"--accessibility",&local_5b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e0,"encryption",&local_5e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_608,"restrict document accessibility",&local_609);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_630,
             "--accessibility=[y|n]\n\nThis option is ignored except with very old encryption formats.\nThe current PDF specification does not allow restriction of\ndocument accessibility. This option is not available with 40-bit\nencryption.\n"
             ,&local_631);
  QPDFArgParser::addOptionHelp(pQVar1,&local_5b8,&local_5e0,&local_608,&local_630);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator(&local_631);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator(&local_609);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator(&local_5e1);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_658,"--annotate",&local_659);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_680,"encryption",&local_681);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6a8,"restrict document annotation",&local_6a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d0,
             "--annotate=[y|n]\n\nEnable/disable modifying annotations including making comments\nand filling in form fields. For 128-bit and 256-bit encryption,\nthis also enables editing, creating, and deleting form fields\nunless --modify-other=n or --modify=none is also specified.\n"
             ,&local_6d1);
  QPDFArgParser::addOptionHelp(pQVar1,&local_658,&local_680,&local_6a8,&local_6d0);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::allocator<char>::~allocator(&local_6d1);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator(&local_681);
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator(&local_659);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f8,"--assemble",&local_6f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_720,"encryption",&local_721);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_748,"restrict document assembly",&local_749);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_770,
             "--assemble=[y|n]\n\nEnable/disable document assembly (rotation and reordering of\npages). This option is not available with 40-bit encryption.\n"
             ,&local_771);
  QPDFArgParser::addOptionHelp(pQVar1,&local_6f8,&local_720,&local_748,&local_770);
  std::__cxx11::string::~string((string *)&local_770);
  std::allocator<char>::~allocator(&local_771);
  std::__cxx11::string::~string((string *)&local_748);
  std::allocator<char>::~allocator(&local_749);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator(&local_721);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_798,"--extract",&local_799);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7c0,"encryption",&local_7c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"restrict text/graphic extraction",&local_7e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_810,
             "--extract=[y|n]\n\nEnable/disable text/graphic extraction for purposes other than\naccessibility.\n"
             ,&local_811);
  QPDFArgParser::addOptionHelp(pQVar1,&local_798,&local_7c0,&local_7e8,&local_810);
  std::__cxx11::string::~string((string *)&local_810);
  std::allocator<char>::~allocator(&local_811);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::allocator<char>::~allocator(&local_7e9);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::allocator<char>::~allocator(&local_7c1);
  std::__cxx11::string::~string((string *)&local_798);
  std::allocator<char>::~allocator(&local_799);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_838,"--form",&local_839);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_860,"encryption",&local_861);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_888,"restrict form filling",&local_889);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8b0,
             "--form=[y|n]\n\nEnable/disable whether filling form fields is allowed even if\nmodification of annotations is disabled. This option is not\navailable with 40-bit encryption.\n"
             ,&local_8b1);
  QPDFArgParser::addOptionHelp(pQVar1,&local_838,&local_860,&local_888,&local_8b0);
  std::__cxx11::string::~string((string *)&local_8b0);
  std::allocator<char>::~allocator(&local_8b1);
  std::__cxx11::string::~string((string *)&local_888);
  std::allocator<char>::~allocator(&local_889);
  std::__cxx11::string::~string((string *)&local_860);
  std::allocator<char>::~allocator(&local_861);
  std::__cxx11::string::~string((string *)&local_838);
  std::allocator<char>::~allocator(&local_839);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8d8,"--modify-other",&local_8d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_900,"encryption",&local_901);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_928,"restrict other modifications",&local_929);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_950,
             "--modify-other=[y|n]\n\nEnable/disable modifications not controlled by --assemble,\n--annotate, or --form. --modify-other=n is implied by any of the\nother --modify options. This option is not available with 40-bit\nencryption.\n"
             ,&local_951);
  QPDFArgParser::addOptionHelp(pQVar1,&local_8d8,&local_900,&local_928,&local_950);
  std::__cxx11::string::~string((string *)&local_950);
  std::allocator<char>::~allocator(&local_951);
  std::__cxx11::string::~string((string *)&local_928);
  std::allocator<char>::~allocator(&local_929);
  std::__cxx11::string::~string((string *)&local_900);
  std::allocator<char>::~allocator(&local_901);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::allocator<char>::~allocator(&local_8d9);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_978,"--modify",&local_979);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9a0,"encryption",&local_9a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9c8,"restrict document modification",&local_9c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9f0,
             "--modify=modify-opt\n\nFor 40-bit files, modify-opt may only be y or n and controls all\naspects of document modification.\n\nFor 128-bit and 256-bit encryption, modify-opt values allow\nenabling and disabling levels of restriction in a manner similar\nto how some PDF creation tools do it. modify-opt values map to\nother combinations of options as follows:\n\nall: allow full modification (the default)\nannotate: --modify-other=n\nform: --modify-other=n --annotate=n\nassembly: --modify-other=n --annotate=n --form=n\nnone: --modify-other=n --annotate=n --form=n --assemble=n\n"
             ,&local_9f1);
  QPDFArgParser::addOptionHelp(pQVar1,&local_978,&local_9a0,&local_9c8,&local_9f0);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::allocator<char>::~allocator(&local_9f1);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::allocator<char>::~allocator(&local_9c9);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::allocator<char>::~allocator(&local_9a1);
  std::__cxx11::string::~string((string *)&local_978);
  std::allocator<char>::~allocator(&local_979);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a18,"--print",&local_a19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a40,"encryption",&local_a41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a68,"restrict printing",&local_a69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a90,
             "--print=print-opt\n\nControl what kind of printing is allowed. For 40-bit encryption,\nprint-opt may only be y or n and enables or disables all\nprinting. For 128-bit and 256-bit encryption, print-opt may have\nthe following values:\n\nnone: disallow printing\nlow: allow low-resolution printing only\nfull: allow full printing (the default)\n"
             ,&local_a91);
  QPDFArgParser::addOptionHelp(pQVar1,&local_a18,&local_a40,&local_a68,&local_a90);
  std::__cxx11::string::~string((string *)&local_a90);
  std::allocator<char>::~allocator(&local_a91);
  std::__cxx11::string::~string((string *)&local_a68);
  std::allocator<char>::~allocator(&local_a69);
  std::__cxx11::string::~string((string *)&local_a40);
  std::allocator<char>::~allocator(&local_a41);
  std::__cxx11::string::~string((string *)&local_a18);
  std::allocator<char>::~allocator(&local_a19);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ab8,"--cleartext-metadata",&local_ab9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ae0,"encryption",&local_ae1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b08,"don\'t encrypt metadata",&local_b09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b30,
             "If specified, don\'t encrypt document metadata even when\nencrypting the rest of the document. This option is not\navailable with 40-bit encryption.\n"
             ,&local_b31);
  QPDFArgParser::addOptionHelp(pQVar1,&local_ab8,&local_ae0,&local_b08,&local_b30);
  std::__cxx11::string::~string((string *)&local_b30);
  std::allocator<char>::~allocator(&local_b31);
  std::__cxx11::string::~string((string *)&local_b08);
  std::allocator<char>::~allocator(&local_b09);
  std::__cxx11::string::~string((string *)&local_ae0);
  std::allocator<char>::~allocator(&local_ae1);
  std::__cxx11::string::~string((string *)&local_ab8);
  std::allocator<char>::~allocator(&local_ab9);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b58,"--use-aes",&local_b59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b80,"encryption",&local_b81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ba8,"use AES with 128-bit encryption",&local_ba9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bd0,
             "--use-aes=[y|n]\n\nEnables/disables use of the more secure AES encryption with\n128-bit encryption. Specifying --use-aes=y forces the PDF\nversion to be at least 1.6. This option is only available with\n128-bit encryption. The default is \"n\" for compatibility\nreasons. Use 256-bit encryption instead.\n"
             ,&local_bd1);
  QPDFArgParser::addOptionHelp(pQVar1,&local_b58,&local_b80,&local_ba8,&local_bd0);
  std::__cxx11::string::~string((string *)&local_bd0);
  std::allocator<char>::~allocator(&local_bd1);
  std::__cxx11::string::~string((string *)&local_ba8);
  std::allocator<char>::~allocator(&local_ba9);
  std::__cxx11::string::~string((string *)&local_b80);
  std::allocator<char>::~allocator(&local_b81);
  std::__cxx11::string::~string((string *)&local_b58);
  std::allocator<char>::~allocator(&local_b59);
  return;
}

Assistant:

static void add_help_5(QPDFArgParser& ap)
{
ap.addOptionHelp("--remove-info", "modification", "remove file information", R"(Exclude file information (except modification date) from the output file.
)");
ap.addOptionHelp("--remove-metadata", "modification", "remove metadata", R"(Exclude metadata from the output file.
)");
ap.addOptionHelp("--remove-page-labels", "modification", "remove explicit page numbers", R"(Exclude page labels (explicit page numbers) from the output file.
)");
ap.addOptionHelp("--remove-structure", "modification", "remove metadata", R"(Exclude the structure tree from the output file.
)");
ap.addOptionHelp("--set-page-labels", "modification", "number pages for the entire document", R"(--set-page-labels label-spec ... --

Set page labels (explicit page numbers) for the entire file.
Each label-spec has the form

first-page:[type][/start[/prefix]]

where

- "first-page" represents a sequential page number using the
  same format as page ranges: a number, a number preceded by "r"
  to indicate counting from the end, or "z" indicating the last
  page
- "type" is one of
  - D: Arabic numerals (digits)
  - A: Upper-case alphabetic characters
  - a: Lower-case alphabetic characters
  - R: Upper-case Roman numerals
  - r: Lower-case Roman numerals
  - omitted: the page number does not appear, though the prefix,
    if specified will still appear
- "start" must be a number >= 1
- "prefix"` may be any string and is prepended to each page
  label

The first label spec must have a first-page value of 1,
indicating the first page of the document. If multiple page
label specs are specified, they must be given in increasing
order.

If multiple page label specs are specified, they must be given
in increasing order.

A given page label spec causes pages to be numbered according to
that scheme starting with first-page and continuing until the
next label spec or the end of the document. If you want to omit
numbering starting at a certain page, you can use first-page: as
the spec.

Example: "1:r 5:D" would number the first four pages i through
iv, then the remaining pages with Arabic numerals starting with
1 and continuing sequentially until the end of the document. For
additional examples, please consult the manual.
)");
ap.addHelpTopic("encryption", "create encrypted files", R"(Create encrypted files. Usage:

--encrypt \
  [--user-password=user-password] \
  [--owner-password=owner-password] \
  --bits=key-length [options] --

OR

--encrypt user-password owner-password key-length [options] --

The first form, with flags for the passwords and bit length, was
introduced in qpdf 11.7.0. Only the --bits option is mandatory.
This form allows you to use any text as the password. If passwords
are specified, they must be given before the --bits option.

The second form has been in qpdf since the beginning and will
continue to be supported. Either or both of user-password and
owner-password may be empty strings.

The key-length parameter must be either 40, 128, or 256. The user
and/or owner password may be omitted. Omitting either password
enables the PDF file to be opened without a password. Specifying
the same value for the user and owner password and specifying an
empty owner password are both considered insecure.

Encryption options are terminated by "--" by itself.

40-bit encryption is insecure, as is 128-bit encryption without
AES. Use 256-bit encryption unless you have a specific reason to
use an insecure format, such as testing or compatibility with very
old viewers. You must use the --allow-weak-crypto flag to create
encrypted files that use insecure cryptographic algorithms. The
--allow-weak-crypto flag appears outside of --encrypt ... --
(before --encrypt or after --).

Available options vary by key length. Not all readers respect all
restrictions. Different PDF readers respond differently to various
combinations of options. Sometimes a PDF viewer may show you
restrictions that differ from what you selected. This is probably
not a bug in qpdf.

Options for 40-bit only:
  --annotate=[y|n]         restrict comments, filling forms, and signing
  --extract=[y|n]          restrict text/graphic extraction
  --modify=[y|n]           restrict document modification
  --print=[y|n]            restrict printing

Options for 128-bit or 256-bit:
  --accessibility=[y|n]    restrict accessibility (usually ignored)
  --annotate=[y|n]         restrict commenting/filling form fields
  --assemble=[y|n]         restrict document assembly
  --extract=[y|n]          restrict text/graphic extraction
  --form=[y|n]             restrict filling form fields
  --modify-other=[y|n]     restrict other modifications
  --modify=modify-opt      control modify access by level
  --print=print-opt        control printing access
  --cleartext-metadata     prevent encryption of metadata

For 128-bit only:
  --use-aes=[y|n]          indicates whether to use AES encryption
  --force-V4               forces use of V=4 encryption handler

For 256-bit only:
  --force-R5               forces use of deprecated R=5 encryption
  --allow-insecure         allow user password with empty owner password

Values for print-opt:
  none                     disallow printing
  low                      allow only low-resolution printing
  full                     allow full printing

Values for modify-opt:
  none                     allow no modifications
  assembly                 allow document assembly only
  form                     assembly + filling in form fields and signing
  annotate                 form + commenting and modifying forms
  all                      allow full document modification
)");
ap.addOptionHelp("--user-password", "encryption", "specify user password", R"(--user-password=user-password

Set the user password of the encrypted file.
)");
ap.addOptionHelp("--owner-password", "encryption", "specify owner password", R"(--owner-password=owner-password

Set the owner password of the encrypted file.
)");
ap.addOptionHelp("--bits", "encryption", "specify encryption key length", R"(--bits={48|128|256}

Specify the encryption key length. For best security, always use
a key length of 256.
)");
ap.addOptionHelp("--accessibility", "encryption", "restrict document accessibility", R"(--accessibility=[y|n]

This option is ignored except with very old encryption formats.
The current PDF specification does not allow restriction of
document accessibility. This option is not available with 40-bit
encryption.
)");
ap.addOptionHelp("--annotate", "encryption", "restrict document annotation", R"(--annotate=[y|n]

Enable/disable modifying annotations including making comments
and filling in form fields. For 128-bit and 256-bit encryption,
this also enables editing, creating, and deleting form fields
unless --modify-other=n or --modify=none is also specified.
)");
ap.addOptionHelp("--assemble", "encryption", "restrict document assembly", R"(--assemble=[y|n]

Enable/disable document assembly (rotation and reordering of
pages). This option is not available with 40-bit encryption.
)");
ap.addOptionHelp("--extract", "encryption", "restrict text/graphic extraction", R"(--extract=[y|n]

Enable/disable text/graphic extraction for purposes other than
accessibility.
)");
ap.addOptionHelp("--form", "encryption", "restrict form filling", R"(--form=[y|n]

Enable/disable whether filling form fields is allowed even if
modification of annotations is disabled. This option is not
available with 40-bit encryption.
)");
ap.addOptionHelp("--modify-other", "encryption", "restrict other modifications", R"(--modify-other=[y|n]

Enable/disable modifications not controlled by --assemble,
--annotate, or --form. --modify-other=n is implied by any of the
other --modify options. This option is not available with 40-bit
encryption.
)");
ap.addOptionHelp("--modify", "encryption", "restrict document modification", R"(--modify=modify-opt

For 40-bit files, modify-opt may only be y or n and controls all
aspects of document modification.

For 128-bit and 256-bit encryption, modify-opt values allow
enabling and disabling levels of restriction in a manner similar
to how some PDF creation tools do it. modify-opt values map to
other combinations of options as follows:

all: allow full modification (the default)
annotate: --modify-other=n
form: --modify-other=n --annotate=n
assembly: --modify-other=n --annotate=n --form=n
none: --modify-other=n --annotate=n --form=n --assemble=n
)");
ap.addOptionHelp("--print", "encryption", "restrict printing", R"(--print=print-opt

Control what kind of printing is allowed. For 40-bit encryption,
print-opt may only be y or n and enables or disables all
printing. For 128-bit and 256-bit encryption, print-opt may have
the following values:

none: disallow printing
low: allow low-resolution printing only
full: allow full printing (the default)
)");
ap.addOptionHelp("--cleartext-metadata", "encryption", "don't encrypt metadata", R"(If specified, don't encrypt document metadata even when
encrypting the rest of the document. This option is not
available with 40-bit encryption.
)");
ap.addOptionHelp("--use-aes", "encryption", "use AES with 128-bit encryption", R"(--use-aes=[y|n]

Enables/disables use of the more secure AES encryption with
128-bit encryption. Specifying --use-aes=y forces the PDF
version to be at least 1.6. This option is only available with
128-bit encryption. The default is "n" for compatibility
reasons. Use 256-bit encryption instead.
)");
}